

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * strchr(char *__s,int __c)

{
  char cVar1;
  char c_;
  char *pcStack_18;
  int c_local;
  char *s_local;
  
  pcStack_18 = __s;
  do {
    if (*pcStack_18 == (char)__c) {
      return pcStack_18;
    }
    cVar1 = *pcStack_18;
    pcStack_18 = pcStack_18 + 1;
  } while (cVar1 != '\0');
  return (char *)0x0;
}

Assistant:

char *strchr(const char *s, int c) {
    const char c_ = (char)c;
    do {
        if (*s == c_) {
            return (char *)s;
        }
    } while (*s++ != '\0');
    return NULL;
}